

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O3

string * EncodeBase58_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> input)

{
  int iVar1;
  uint uVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __tmp;
  ulong uVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  size_type __n2;
  byte *pbVar11;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b58;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  long local_38;
  
  uVar7 = input.m_size;
  pbVar11 = input.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  if (uVar7 == 0) {
    uVar8 = 0;
    __n2 = 0;
  }
  else {
    uVar3 = 0;
    uVar8 = uVar7;
    do {
      if (pbVar11[uVar3] != 0) {
        uVar7 = uVar3 & 0xffffffff;
        goto LAB_00d3518d;
      }
      uVar3 = uVar3 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    uVar8 = 0;
    uVar3 = uVar7;
LAB_00d3518d:
    pbVar11 = pbVar11 + uVar3;
    __n2 = uVar7 & 0xffffffff;
  }
  iVar9 = (int)((uVar8 * 0x8a) / 100) + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_50,(long)iVar9,&local_51);
  if (uVar8 != 0) {
    uVar2 = 0;
    do {
      uVar5 = (uint)*pbVar11;
      uVar10 = 0;
      if (uVar5 != 0 || uVar2 != 0) {
        uVar10 = 0;
        pbVar4 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          if (pbVar4 == local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
            if (uVar5 != 0) {
              __assert_fail("carry == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/base58.cpp"
                            ,0x70,"std::string EncodeBase58(Span<const unsigned char>)");
            }
            break;
          }
          iVar1 = (uint)pbVar4[-1] * 0x100 + uVar5;
          iVar6 = uVar5 + (uint)pbVar4[-1] * 0x100;
          uVar5 = iVar1 / 0x3a;
          pbVar4[-1] = (char)iVar1 + (char)uVar5 * -0x3a;
          pbVar4 = pbVar4 + -1;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar2 || iVar6 - 0x3aU < 0xffffff8d);
      }
      uVar2 = uVar10;
      pbVar11 = pbVar11 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  pbVar11 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + (int)(iVar9 - uVar2);
  pbVar4 = pbVar11;
  for (; (pbVar11 !=
          local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish && (pbVar4 = pbVar11, *pbVar11 == 0));
      pbVar11 = pbVar11 + 1) {
    pbVar4 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (size_type)
             (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish + (__n2 - (long)pbVar4)));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
            (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,__n2,'1');
  for (; pbVar4 != local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,
               "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"[*pbVar4]);
  }
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeBase58(Span<const unsigned char> input)
{
    // Skip & count leading zeroes.
    int zeroes = 0;
    int length = 0;
    while (input.size() > 0 && input[0] == 0) {
        input = input.subspan(1);
        zeroes++;
    }
    // Allocate enough space in big-endian base58 representation.
    int size = input.size() * 138 / 100 + 1; // log(256) / log(58), rounded up.
    std::vector<unsigned char> b58(size);
    // Process the bytes.
    while (input.size() > 0) {
        int carry = input[0];
        int i = 0;
        // Apply "b58 = b58 * 256 + ch".
        for (std::vector<unsigned char>::reverse_iterator it = b58.rbegin(); (carry != 0 || i < length) && (it != b58.rend()); it++, i++) {
            carry += 256 * (*it);
            *it = carry % 58;
            carry /= 58;
        }

        assert(carry == 0);
        length = i;
        input = input.subspan(1);
    }
    // Skip leading zeroes in base58 result.
    std::vector<unsigned char>::iterator it = b58.begin() + (size - length);
    while (it != b58.end() && *it == 0)
        it++;
    // Translate the result into a string.
    std::string str;
    str.reserve(zeroes + (b58.end() - it));
    str.assign(zeroes, '1');
    while (it != b58.end())
        str += pszBase58[*(it++)];
    return str;
}